

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O1

void remove_child(dl_t children_list,TreeNode *c)

{
  dl_el_s *pdVar1;
  dl_el *__ptr;
  dl_t _curr_dl;
  
  __ptr = children_list->first;
  while( true ) {
    if (__ptr == (dl_el *)0x0) {
      return;
    }
    if ((TreeNode *)__ptr[1].prev == c) break;
    __ptr = __ptr->next;
  }
  if (children_list->first == __ptr) {
    children_list->first = __ptr->next;
  }
  if (children_list->last == __ptr) {
    children_list->last = __ptr->prev;
  }
  pdVar1 = __ptr->next;
  if (pdVar1 != (dl_el_s *)0x0) {
    pdVar1->prev = __ptr->prev;
  }
  if (__ptr->prev != (dl_el_s *)0x0) {
    __ptr->prev->next = pdVar1;
  }
  free(__ptr);
  children_list->count = children_list->count - 1;
  return;
}

Assistant:

void remove_child(dl_t children_list, TreeNode* c)
{
  TreeNode *child;
  dl_forall(TreeNode*, children_list, child) {
    if (child==c) {
      dl_delete_current();
      break;
    }
  } dl_endfor;
}